

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O2

Expression cnn::expr::contract3d_1d_1d(Expression *x,Expression *y,Expression *z,Expression *b)

{
  ComputationGraph *arguments;
  undefined8 extraout_RDX;
  Expression EVar1;
  
  arguments = y->pg;
  ComputationGraph::add_function<cnn::InnerProduct3D_1D_1D>
            ((ComputationGraph *)&x->i,(initializer_list<cnn::VariableIndex> *)arguments);
  x->pg = arguments;
  EVar1._8_8_ = extraout_RDX;
  EVar1.pg = (ComputationGraph *)x;
  return EVar1;
}

Assistant:

Expression contract3d_1d_1d(const Expression& x, const Expression& y, const Expression& z, const Expression& b) { return Expression(x.pg, x.pg->add_function<InnerProduct3D_1D_1D>({x.i, y.i, z.i, b.i})); }